

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::RemoveNesting(ON_PolyCurve *this)

{
  double t0;
  int iVar1;
  ON_Curve **ppOVar2;
  ON_PolyCurve *poly_00;
  double *pdVar3;
  ON_Interval local_70;
  ON_PolyCurve *local_60;
  ON_PolyCurve *poly;
  int i;
  undefined1 local_48 [8];
  ON_SimpleArray<ON_Curve_*> old_seg;
  ON_SimpleArray<double> old_t;
  int n;
  bool rc;
  ON_PolyCurve *this_local;
  
  old_t.m_capacity._3_1_ = false;
  iVar1 = Count(this);
  ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&old_seg.m_count,&this->m_t);
  ON_SimpleArray<ON_Curve_*>::ON_SimpleArray
            ((ON_SimpleArray<ON_Curve_*> *)local_48,
             &(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
  ON_SimpleArray<double>::SetCount(&this->m_t,1);
  ON_SimpleArray<ON_Curve_*>::SetCount(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
  for (poly._0_4_ = 0; (int)poly < iVar1; poly._0_4_ = (int)poly + 1) {
    ppOVar2 = ON_SimpleArray<ON_Curve_*>::operator[]
                        ((ON_SimpleArray<ON_Curve_*> *)local_48,(int)poly);
    poly_00 = Cast((ON_Object *)*ppOVar2);
    local_60 = poly_00;
    if (poly_00 == (ON_PolyCurve *)0x0) {
      pdVar3 = ON_SimpleArray<double>::operator[]
                         ((ON_SimpleArray<double> *)&old_seg.m_count,(int)poly + 1);
      ON_SimpleArray<double>::Append(&this->m_t,pdVar3);
      ppOVar2 = ON_SimpleArray<ON_Curve_*>::operator[]
                          ((ON_SimpleArray<ON_Curve_*> *)local_48,(int)poly);
      ON_SimpleArray<ON_Curve_*>::Append
                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,ppOVar2);
    }
    else {
      old_t.m_capacity._3_1_ = true;
      pdVar3 = ON_SimpleArray<double>::operator[]
                         ((ON_SimpleArray<double> *)&old_seg.m_count,(int)poly);
      t0 = *pdVar3;
      pdVar3 = ON_SimpleArray<double>::operator[]
                         ((ON_SimpleArray<double> *)&old_seg.m_count,(int)poly + 1);
      ON_Interval::ON_Interval(&local_70,t0,*pdVar3);
      Flatten(poly_00,local_70,&this->m_t,&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
      if (local_60 != (ON_PolyCurve *)0x0) {
        (*(local_60->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
    }
  }
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)local_48);
  ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&old_seg.m_count);
  return old_t.m_capacity._3_1_;
}

Assistant:

bool ON_PolyCurve::RemoveNesting( )
{
  bool rc = false;
	int n = Count();

	ON_SimpleArray<double> old_t = m_t;
	ON_SimpleArray<ON_Curve*> old_seg = m_segment;

	m_t.SetCount(1);
	m_segment.SetCount(0);

	for(int i=0; i<n;i++){
		ON_PolyCurve* poly = ON_PolyCurve::Cast( old_seg[i]);
		if(poly){
      rc = true;
			Flatten( poly, ON_Interval(old_t[i], old_t[i+1]), m_t, m_segment );
			delete poly;
		} else {
			m_t.Append( old_t[i+1]); 
			m_segment.Append( old_seg[i] );
		}
	}
  return rc;
}